

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preEnd__source_data
          (ColladaParserAutoGen14Private *this)

{
  byte bVar1;
  bool bVar2;
  long in_RDI;
  bool returnValue;
  URI parameter;
  ParserChar *ptrForErr;
  bool failed;
  URI *in_stack_fffffffffffffdf0;
  StackMemoryManager *in_stack_fffffffffffffe00;
  bool *in_stack_fffffffffffffe08;
  ParserChar *in_stack_fffffffffffffe10;
  ParserChar **in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe77;
  URI *in_stack_fffffffffffffe78;
  URI *in_stack_fffffffffffffe80;
  ParserChar *in_stack_fffffffffffffed8;
  ParserChar *in_stack_fffffffffffffee0;
  StringHash in_stack_fffffffffffffee8;
  ErrorType in_stack_fffffffffffffef0;
  Severity in_stack_fffffffffffffef4;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  byte local_9;
  
  GeneratedSaxParser::Utils::toURI
            (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  if ((local_9 & 1) == 0) {
    in_stack_fffffffffffffdf0 = *(URI **)(in_RDI + 0x108);
    COLLADABU::URI::URI(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                        (bool)in_stack_fffffffffffffe77);
    bVar1 = (**(code **)(*(long *)&in_stack_fffffffffffffdf0->mUriString + 0xb0))
                      (in_stack_fffffffffffffdf0,&stack0xfffffffffffffe10);
    bVar1 = bVar1 & 1;
    COLLADABU::URI::~URI(in_stack_fffffffffffffdf0);
  }
  else {
    bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                      ((ParserTemplateBase *)
                       CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
                       in_stack_fffffffffffffef4,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8
                       ,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    bVar1 = (bVar2 ^ 0xffU) & 1;
  }
  if (*(long *)(in_RDI + 0x90) != 0) {
    GeneratedSaxParser::StackMemoryManager::deleteObject(in_stack_fffffffffffffe00);
  }
  *(undefined8 *)(in_RDI + 0x90) = 0;
  *(undefined8 *)(in_RDI + 0x98) = 0;
  COLLADABU::URI::~URI(in_stack_fffffffffffffdf0);
  return (bool)(bVar1 & 1);
}

Assistant:

bool ColladaParserAutoGen14Private::_preEnd__source_data()
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateEnd__source_data();
        if ( !validationResult ) return false;

    } // validation
#endif

bool failed;
const ParserChar* ptrForErr = mLastIncompleteFragmentInCharacterData;
DISABLE_WARNING_UNUSED(ptrForErr)
COLLADABU::URI parameter = GeneratedSaxParser::Utils::toURI((const ParserChar**)&mLastIncompleteFragmentInCharacterData, mEndOfDataInCurrentObjectOnStack, failed);
bool returnValue;
if (!failed)
{
    returnValue = mImpl->data__source_data(parameter);
}
else
    returnValue = !handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_TEXTDATA_PARSING_FAILED, HASH_ELEMENT_SOURCE_DATA, (const ParserChar*)0, mLastIncompleteFragmentInCharacterData);
if (mLastIncompleteFragmentInCharacterData)
    mStackMemoryManager.deleteObject();
mLastIncompleteFragmentInCharacterData = 0;
mEndOfDataInCurrentObjectOnStack = 0;
return returnValue;
}